

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
upb::generator::(anonymous_namespace)::MapValueCType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDefPtr map_field)

{
  FieldDefPtr field;
  MessageDefPtr local_28;
  upb_FieldDef *local_20;
  FieldDefPtr local_18;
  FieldDefPtr map_field_local;
  
  local_18.ptr_ = (upb_FieldDef *)this;
  map_field_local.ptr_ = (upb_FieldDef *)__return_storage_ptr__;
  local_28 = FieldDefPtr::message_type(&local_18);
  local_20 = (upb_FieldDef *)MessageDefPtr::map_value(&local_28);
  CType_abi_cxx11_(__return_storage_ptr__,(_anonymous_namespace_ *)local_20,field);
  return __return_storage_ptr__;
}

Assistant:

std::string MapValueCType(upb::FieldDefPtr map_field) {
  return CType(map_field.message_type().map_value());
}